

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderEntPush(xmlTextReaderPtr reader,xmlNodePtr value)

{
  int iVar1;
  xmlNodePtr *ppxVar2;
  int newSize;
  xmlNodePtr *tmp;
  xmlNodePtr value_local;
  xmlTextReaderPtr reader_local;
  
  if (reader->entMax <= reader->entNr) {
    iVar1 = xmlGrowCapacity(reader->entMax,8,10,1000000000);
    if (iVar1 < 0) {
      xmlTextReaderErrMemory(reader);
      return -1;
    }
    ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(reader->entTab,(long)iVar1 << 3);
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      xmlTextReaderErrMemory(reader);
      return -1;
    }
    reader->entTab = ppxVar2;
    reader->entMax = iVar1;
  }
  reader->entTab[reader->entNr] = value;
  reader->ent = value;
  iVar1 = reader->entNr;
  reader->entNr = iVar1 + 1;
  return iVar1;
}

Assistant:

static int
xmlTextReaderEntPush(xmlTextReaderPtr reader, xmlNodePtr value)
{
    if (reader->entNr >= reader->entMax) {
        xmlNodePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(reader->entMax, sizeof(tmp[0]),
                                  10, XML_MAX_ITEMS);
        if (newSize < 0) {
            xmlTextReaderErrMemory(reader);
            return (-1);
        }
        tmp = xmlRealloc(reader->entTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
            xmlTextReaderErrMemory(reader);
            return (-1);
        }
        reader->entTab = tmp;
        reader->entMax = newSize;
    }
    reader->entTab[reader->entNr] = value;
    reader->ent = value;
    return (reader->entNr++);
}